

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Token>::initialize<tinyusdz::Token>
          (optional<tinyusdz::Token> *this,Token *value)

{
  if (this->has_value_ != true) {
    std::__cxx11::string::string((string *)&this->contained,(string *)value);
    this->has_value_ = true;
    return;
  }
  __assert_fail("! has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x5dd,
                "void nonstd::optional_lite::optional<tinyusdz::Token>::initialize(V &&) [T = tinyusdz::Token, V = tinyusdz::Token]"
               );
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }